

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

bool __thiscall spvtools::Optimizer::FlagHasValidForm(Optimizer *this,string *flag)

{
  bool bVar1;
  bool bVar2;
  pointer local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = std::operator==(flag,"-O");
  bVar2 = true;
  if ((!bVar1) && (bVar1 = std::operator==(flag,"-Os"), !bVar1)) {
    if (2 < flag->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)flag);
      bVar1 = std::operator==(&local_48,"--");
      std::__cxx11::string::_M_dispose();
      if (bVar1) {
        return true;
      }
    }
    local_48.field_2._M_allocated_capacity = 0;
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    local_50 = (flag->_M_dataplus)._M_p;
    bVar2 = false;
    Errorf<char_const*>(&(((this->impl_)._M_t.
                           super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                           .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)
                         ->pass_manager).consumer_,(char *)0x0,(spv_position_t *)&local_48,
                        "%s is not a valid flag.  Flag passes should have the form \'--pass_name[=pass_args]\'. Special flag names also accepted: -O and -Os."
                        ,&local_50);
  }
  return bVar2;
}

Assistant:

bool Optimizer::FlagHasValidForm(const std::string& flag) const {
  if (flag == "-O" || flag == "-Os") {
    return true;
  } else if (flag.size() > 2 && flag.substr(0, 2) == "--") {
    return true;
  }

  Errorf(consumer(), nullptr, {},
         "%s is not a valid flag.  Flag passes should have the form "
         "'--pass_name[=pass_args]'. Special flag names also accepted: -O "
         "and -Os.",
         flag.c_str());
  return false;
}